

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_frame.hpp
# Opt level: O0

void asd::detail::read_frame_header_impl<std::ifstream>
               (FrameHeader *fh,basic_ifstream<char,_std::char_traits<char>_> *source)

{
  bool bVar1;
  char cVar2;
  short sVar3;
  int iVar4;
  float fVar5;
  basic_ifstream<char,_std::char_traits<char>_> *source_local;
  FrameHeader *fh_local;
  
  iVar4 = read_binary_as<int>((istream *)source);
  fh->number = iVar4;
  sVar3 = read_binary_as<short>((istream *)source);
  fh->max_data = sVar3;
  sVar3 = read_binary_as<short>((istream *)source);
  fh->min_data = sVar3;
  sVar3 = read_binary_as<short>((istream *)source);
  fh->x_offset = sVar3;
  sVar3 = read_binary_as<short>((istream *)source);
  fh->y_offset = sVar3;
  fVar5 = read_binary_as<float>((istream *)source);
  fh->x_tilt = fVar5;
  fVar5 = read_binary_as<float>((istream *)source);
  fh->y_tilt = fVar5;
  bVar1 = read_binary_as<bool>((istream *)source);
  fh->is_stimulated = bVar1;
  cVar2 = read_binary_as<signed_char>((istream *)source);
  fh->_booked1 = cVar2;
  sVar3 = read_binary_as<short>((istream *)source);
  fh->_booked2 = sVar3;
  iVar4 = read_binary_as<int>((istream *)source);
  fh->_booked3 = iVar4;
  iVar4 = read_binary_as<int>((istream *)source);
  fh->_booked4 = iVar4;
  return;
}

Assistant:

void read_frame_header_impl(FrameHeader& fh, sourceT& source)
{
    fh.number        = read_binary_as<std::int32_t>(source);
    fh.max_data      = read_binary_as<std::int16_t>(source);
    fh.min_data      = read_binary_as<std::int16_t>(source);
    fh.x_offset      = read_binary_as<std::int16_t>(source);
    fh.y_offset      = read_binary_as<std::int16_t>(source);
    fh.x_tilt        = read_binary_as<float       >(source);
    fh.y_tilt        = read_binary_as<float       >(source);
    fh.is_stimulated = read_binary_as<bool        >(source);
    fh._booked1      = read_binary_as<std::int8_t >(source);
    fh._booked2      = read_binary_as<std::int16_t>(source);
    fh._booked3      = read_binary_as<std::int32_t>(source);
    fh._booked4      = read_binary_as<std::int32_t>(source);
    return;
}